

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_loadDictionaryContent
                 (ZSTD_matchState_t *ms,ldmState_t *ls,ZSTD_cwksp *ws,ZSTD_CCtx_params *params,
                 void *src,size_t srcSize,ZSTD_dictTableLoadMethod_e dtlm,
                 ZSTD_tableFillPurpose_e tfp)

{
  BYTE *iend;
  int iVar1;
  BYTE *pBVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  ZSTD_compressionParameters cParams1;
  ZSTD_compressionParameters cParams2;
  int iVar14;
  uint uVar15;
  U32 UVar16;
  U32 UVar17;
  uint uVar18;
  BYTE *pBVar19;
  ulong uVar20;
  size_t sVar21;
  size_t extraout_RAX;
  size_t extraout_RAX_00;
  undefined4 extraout_var;
  size_t extraout_RAX_01;
  size_t extraout_RAX_02;
  size_t extraout_RAX_03;
  byte bVar22;
  ulong uVar23;
  BYTE *ip;
  long lVar24;
  BYTE *ip_00;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff94;
  ZSTD_strategy ZVar29;
  undefined4 uStack_64;
  undefined4 uStack_48;
  
  ZVar29 = (ZSTD_strategy)ws;
  uStack_64 = (undefined4)((ulong)ws >> 0x20);
  bVar26 = (params->ldmParams).enableLdm == ZSTD_ps_enable;
  bVar27 = ls != (ldmState_t *)0x0;
  uVar3 = (params->cParams).hashLog;
  uVar4 = (params->cParams).searchLog;
  cParams1.chainLog = uVar4;
  cParams1.windowLog = uVar3;
  uVar5 = (params->cParams).minMatch;
  uVar6 = (params->cParams).targetLength;
  uVar7 = (params->cParams).strategy;
  cParams1.minMatch = uVar7;
  cParams1.searchLog = uVar6;
  uVar8 = (ms->cParams).windowLog;
  uVar9 = (ms->cParams).hashLog;
  uVar10 = (ms->cParams).searchLog;
  cParams2.chainLog = uVar10;
  cParams2.windowLog = uVar9;
  uVar11 = (ms->cParams).minMatch;
  uVar12 = (ms->cParams).targetLength;
  uVar13 = (ms->cParams).strategy;
  cParams2.minMatch = uVar13;
  cParams2.searchLog = uVar12;
  cParams1.hashLog = uVar5;
  cParams1.targetLength = in_stack_ffffffffffffff74;
  cParams1.strategy = uVar8;
  cParams2.hashLog = uVar11;
  cParams2.targetLength = in_stack_ffffffffffffff94;
  cParams2.strategy = ZVar29;
  ZSTD_assertEqualCParams(cParams1,cParams2);
  bVar25 = 0xfffffffd < (params->cParams).strategy - ZSTD_greedy;
  bVar28 = tfp == ZSTD_tfp_forCDict;
  if ((bVar28 && bVar25) && (bVar27 && bVar26)) {
    __assert_fail("!loadLdmDict",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x6322,
                  "size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t *, ldmState_t *, ZSTD_cwksp *, const ZSTD_CCtx_params *, const void *, size_t, ZSTD_dictTableLoadMethod_e, ZSTD_tableFillPurpose_e)"
                 );
  }
  iend = (BYTE *)((long)src + srcSize);
  lVar24 = -0xfffffe;
  if (!bVar28 || !bVar25) {
    lVar24 = -0xdffffffe;
  }
  uVar23 = 0xfffffe;
  if (!bVar28 || !bVar25) {
    uVar23 = 0xdffffffe;
  }
  ip_00 = iend + lVar24;
  if (srcSize <= uVar23) {
    ip_00 = (BYTE *)src;
    uVar23 = srcSize;
  }
  iVar14 = (int)iend;
  if (0x1fffffff < uVar23) {
    if (((ms->window).dictLimit != 2) || ((ms->window).lowLimit != 2)) {
LAB_001b186b:
      __assert_fail("ZSTD_window_isEmpty(ms->window)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x632f,
                    "size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t *, ldmState_t *, ZSTD_cwksp *, const ZSTD_CCtx_params *, const void *, size_t, ZSTD_dictTableLoadMethod_e, ZSTD_tableFillPurpose_e)"
                   );
    }
    pBVar2 = (ms->window).nextSrc;
    pBVar19 = (ms->window).base;
    if ((long)pBVar2 - (long)pBVar19 != 2) goto LAB_001b186b;
    if (!bVar27 || !bVar26) {
      if (pBVar19 == (BYTE *)0x0) goto LAB_001b180e;
      if ((ms->window).dictBase == (BYTE *)0x0) goto LAB_001b182d;
      if (pBVar2 != ip_00) {
        (ms->window).lowLimit = 2;
        (ms->window).dictLimit = 2;
        (ms->window).dictBase = pBVar19;
        (ms->window).base = ip_00 + -2;
        (ms->window).lowLimit = 2;
      }
      pBVar19 = ip_00 + uVar23;
      (ms->window).nextSrc = pBVar19;
      pBVar2 = (ms->window).dictBase;
      uVar18 = (ms->window).dictLimit;
      if (ip_00 < pBVar2 + uVar18 && pBVar2 + (ms->window).lowLimit < pBVar19) {
        uVar15 = (uint)((long)pBVar19 - (long)pBVar2);
        if ((long)(ulong)uVar18 < (long)pBVar19 - (long)pBVar2) {
          uVar15 = uVar18;
        }
        (ms->window).lowLimit = uVar15;
      }
      goto LAB_001b168b;
    }
    if ((((ls->window).dictLimit != 2) || ((ls->window).lowLimit != 2)) ||
       ((long)(ls->window).nextSrc - (long)(ls->window).base != 2)) {
      __assert_fail("ZSTD_window_isEmpty(ls->window)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x6330,
                    "size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t *, ldmState_t *, ZSTD_cwksp *, const ZSTD_CCtx_params *, const void *, size_t, ZSTD_dictTableLoadMethod_e, ZSTD_tableFillPurpose_e)"
                   );
    }
  }
  if (srcSize != 0) {
    pBVar2 = (ms->window).base;
    if (pBVar2 == (BYTE *)0x0) goto LAB_001b180e;
    if ((ms->window).dictBase == (BYTE *)0x0) goto LAB_001b182d;
    pBVar19 = (ms->window).nextSrc;
    if (pBVar19 != ip_00) {
      uVar20 = (long)pBVar19 - (long)pBVar2;
      UVar17 = (ms->window).dictLimit;
      (ms->window).lowLimit = UVar17;
      if (uVar20 >> 0x20 != 0) goto LAB_001b184c;
      UVar16 = (U32)uVar20;
      (ms->window).dictLimit = UVar16;
      (ms->window).dictBase = pBVar2;
      (ms->window).base = ip_00 + -uVar20;
      if (UVar16 - UVar17 < 8) {
        (ms->window).lowLimit = UVar16;
      }
    }
    pBVar19 = ip_00 + uVar23;
    (ms->window).nextSrc = pBVar19;
    pBVar2 = (ms->window).dictBase;
    uVar18 = (ms->window).dictLimit;
    if (ip_00 < pBVar2 + uVar18 && pBVar2 + (ms->window).lowLimit < pBVar19) {
      uVar15 = (uint)((long)pBVar19 - (long)pBVar2);
      if ((long)(ulong)uVar18 < (long)pBVar19 - (long)pBVar2) {
        uVar15 = uVar18;
      }
      (ms->window).lowLimit = uVar15;
    }
  }
  if (bVar27 && bVar26) {
    if (srcSize != 0) {
      pBVar2 = (ls->window).base;
      if (pBVar2 == (BYTE *)0x0) {
LAB_001b180e:
        __assert_fail("window->base != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x48d8,"U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t, int)");
      }
      if ((ls->window).dictBase == (BYTE *)0x0) {
LAB_001b182d:
        __assert_fail("window->dictBase != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x48d9,"U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t, int)");
      }
      pBVar19 = (ls->window).nextSrc;
      if (pBVar19 != ip_00) {
        uVar20 = (long)pBVar19 - (long)pBVar2;
        UVar17 = (ls->window).dictLimit;
        (ls->window).lowLimit = UVar17;
        if (uVar20 >> 0x20 != 0) {
LAB_001b184c:
          __assert_fail("distanceFromBase == (size_t)(U32)distanceFromBase",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x48e0,"U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t, int)"
                       );
        }
        UVar16 = (U32)uVar20;
        (ls->window).dictLimit = UVar16;
        (ls->window).dictBase = pBVar2;
        (ls->window).base = ip_00 + -uVar20;
        if (UVar16 - UVar17 < 8) {
          (ls->window).lowLimit = UVar16;
        }
      }
      pBVar19 = ip_00 + uVar23;
      (ls->window).nextSrc = pBVar19;
      pBVar2 = (ls->window).dictBase;
      uVar18 = (ls->window).dictLimit;
      if (ip_00 < pBVar2 + uVar18 && pBVar2 + (ls->window).lowLimit < pBVar19) {
        uVar15 = (uint)((long)pBVar19 - (long)pBVar2);
        if ((long)(ulong)uVar18 < (long)pBVar19 - (long)pBVar2) {
          uVar15 = uVar18;
        }
        (ls->window).lowLimit = uVar15;
      }
    }
    UVar17 = 0;
    if (params->forceWindow == 0) {
      UVar17 = iVar14 - *(int *)&(ls->window).base;
    }
    ls->loadedDictEnd = UVar17;
    ZSTD_ldm_fillHashTable(ls,ip_00,iend,&params->ldmParams);
  }
LAB_001b168b:
  if ((params->cParams).strategy < ZSTD_btultra) {
    uVar18 = (params->cParams).chainLog;
    uVar15 = (params->cParams).hashLog;
    if (uVar18 < uVar15) {
      uVar18 = uVar15;
    }
    bVar22 = 0x1c;
    if (uVar18 < 0x1c) {
      bVar22 = (byte)uVar18;
    }
    uVar20 = (ulong)(uint)(8 << (bVar22 & 0x1f));
    if (uVar20 < uVar23) {
      ip_00 = iend + -uVar20;
    }
    if (uVar20 <= uVar23) {
      uVar23 = uVar20;
    }
  }
  iVar1 = *(int *)&(ms->window).base;
  ms->nextToUpdate = (int)ip_00 - iVar1;
  UVar17 = 0;
  if (params->forceWindow == 0) {
    UVar17 = iVar14 - iVar1;
  }
  ms->loadedDictEnd = UVar17;
  sVar21 = (size_t)(uint)params->deterministicRefPrefix;
  ms->forceNonContiguous = params->deterministicRefPrefix;
  if (8 < uVar23) {
    ZSTD_overflowCorrectIfNeeded(ms,(ZSTD_cwksp *)CONCAT44(uStack_64,ZVar29),params,ip_00,iend);
    switch((params->cParams).strategy) {
    case ZSTD_fast:
      ZSTD_fillHashTable(ms,iend,dtlm,tfp);
      sVar21 = extraout_RAX_01;
      break;
    case ZSTD_dfast:
      ZSTD_fillDoubleHashTable(ms,iend,dtlm,tfp);
      sVar21 = extraout_RAX_02;
      break;
    case ZSTD_greedy:
    case ZSTD_lazy:
    case ZSTD_lazy2:
      if (ms->dedicatedDictSearch == 0) {
        if (params->useRowMatchFinder == ZSTD_ps_enable) {
          memset(ms->tagTable,0,1L << ((byte)(params->cParams).hashLog & 0x3f));
          ZSTD_row_update(ms,iend + -8);
          sVar21 = extraout_RAX_03;
        }
        else {
          if (params->useRowMatchFinder == ZSTD_ps_auto) {
            __assert_fail("params->useRowMatchFinder != ZSTD_ps_auto",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x635f,
                          "size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t *, ldmState_t *, ZSTD_cwksp *, const ZSTD_CCtx_params *, const void *, size_t, ZSTD_dictTableLoadMethod_e, ZSTD_tableFillPurpose_e)"
                         );
          }
          UVar17 = ZSTD_insertAndFindFirstIndex(ms,iend + -8);
          sVar21 = CONCAT44(extraout_var,UVar17);
        }
      }
      else {
        if (ms->chainTable == (U32 *)0x0) {
          __assert_fail("ms->chainTable != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x635c,
                        "size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t *, ldmState_t *, ZSTD_cwksp *, const ZSTD_CCtx_params *, const void *, size_t, ZSTD_dictTableLoadMethod_e, ZSTD_tableFillPurpose_e)"
                       );
        }
        ZSTD_dedicatedDictSearch_lazy_loadDictionary(ms,iend + -8);
        sVar21 = extraout_RAX_00;
      }
      break;
    case ZSTD_btlazy2:
    case ZSTD_btopt:
    case ZSTD_btultra:
    case ZSTD_btultra2:
      ZSTD_updateTree(ms,iend + -8,iend);
      sVar21 = extraout_RAX;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x6375,
                    "size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t *, ldmState_t *, ZSTD_cwksp *, const ZSTD_CCtx_params *, const void *, size_t, ZSTD_dictTableLoadMethod_e, ZSTD_tableFillPurpose_e)"
                   );
    }
    ms->nextToUpdate = iVar14 - *(int *)&(ms->window).base;
  }
  return sVar21;
}

Assistant:

static size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t* ms,
                                         ldmState_t* ls,
                                         ZSTD_cwksp* ws,
                                         ZSTD_CCtx_params const* params,
                                         const void* src, size_t srcSize,
                                         ZSTD_dictTableLoadMethod_e dtlm,
                                         ZSTD_tableFillPurpose_e tfp)
{
    const BYTE* ip = (const BYTE*) src;
    const BYTE* const iend = ip + srcSize;
    int const loadLdmDict = params->ldmParams.enableLdm == ZSTD_ps_enable && ls != NULL;

    /* Assert that the ms params match the params we're being given */
    ZSTD_assertEqualCParams(params->cParams, ms->cParams);

    {   /* Ensure large dictionaries can't cause index overflow */

        /* Allow the dictionary to set indices up to exactly ZSTD_CURRENT_MAX.
         * Dictionaries right at the edge will immediately trigger overflow
         * correction, but I don't want to insert extra constraints here.
         */
        U32 maxDictSize = ZSTD_CURRENT_MAX - ZSTD_WINDOW_START_INDEX;

        int const CDictTaggedIndices = ZSTD_CDictIndicesAreTagged(&params->cParams);
        if (CDictTaggedIndices && tfp == ZSTD_tfp_forCDict) {
            /* Some dictionary matchfinders in zstd use "short cache",
             * which treats the lower ZSTD_SHORT_CACHE_TAG_BITS of each
             * CDict hashtable entry as a tag rather than as part of an index.
             * When short cache is used, we need to truncate the dictionary
             * so that its indices don't overlap with the tag. */
            U32 const shortCacheMaxDictSize = (1u << (32 - ZSTD_SHORT_CACHE_TAG_BITS)) - ZSTD_WINDOW_START_INDEX;
            maxDictSize = MIN(maxDictSize, shortCacheMaxDictSize);
            assert(!loadLdmDict);
        }

        /* If the dictionary is too large, only load the suffix of the dictionary. */
        if (srcSize > maxDictSize) {
            ip = iend - maxDictSize;
            src = ip;
            srcSize = maxDictSize;
        }
    }

    if (srcSize > ZSTD_CHUNKSIZE_MAX) {
        /* We must have cleared our windows when our source is this large. */
        assert(ZSTD_window_isEmpty(ms->window));
        if (loadLdmDict) assert(ZSTD_window_isEmpty(ls->window));
    }
    ZSTD_window_update(&ms->window, src, srcSize, /* forceNonContiguous */ 0);

    DEBUGLOG(4, "ZSTD_loadDictionaryContent(): useRowMatchFinder=%d", (int)params->useRowMatchFinder);

    if (loadLdmDict) { /* Load the entire dict into LDM matchfinders. */
        ZSTD_window_update(&ls->window, src, srcSize, /* forceNonContiguous */ 0);
        ls->loadedDictEnd = params->forceWindow ? 0 : (U32)(iend - ls->window.base);
        ZSTD_ldm_fillHashTable(ls, ip, iend, &params->ldmParams);
    }

    /* If the dict is larger than we can reasonably index in our tables, only load the suffix. */
    if (params->cParams.strategy < ZSTD_btultra) {
        U32 maxDictSize = 8U << MIN(MAX(params->cParams.hashLog, params->cParams.chainLog), 28);
        if (srcSize > maxDictSize) {
            ip = iend - maxDictSize;
            src = ip;
            srcSize = maxDictSize;
        }
    }

    ms->nextToUpdate = (U32)(ip - ms->window.base);
    ms->loadedDictEnd = params->forceWindow ? 0 : (U32)(iend - ms->window.base);
    ms->forceNonContiguous = params->deterministicRefPrefix;

    if (srcSize <= HASH_READ_SIZE) return 0;

    ZSTD_overflowCorrectIfNeeded(ms, ws, params, ip, iend);

    switch(params->cParams.strategy)
    {
    case ZSTD_fast:
        ZSTD_fillHashTable(ms, iend, dtlm, tfp);
        break;
    case ZSTD_dfast:
        ZSTD_fillDoubleHashTable(ms, iend, dtlm, tfp);
        break;

    case ZSTD_greedy:
    case ZSTD_lazy:
    case ZSTD_lazy2:
        assert(srcSize >= HASH_READ_SIZE);
        if (ms->dedicatedDictSearch) {
            assert(ms->chainTable != NULL);
            ZSTD_dedicatedDictSearch_lazy_loadDictionary(ms, iend-HASH_READ_SIZE);
        } else {
            assert(params->useRowMatchFinder != ZSTD_ps_auto);
            if (params->useRowMatchFinder == ZSTD_ps_enable) {
                size_t const tagTableSize = ((size_t)1 << params->cParams.hashLog);
                ZSTD_memset(ms->tagTable, 0, tagTableSize);
                ZSTD_row_update(ms, iend-HASH_READ_SIZE);
                DEBUGLOG(4, "Using row-based hash table for lazy dict");
            } else {
                ZSTD_insertAndFindFirstIndex(ms, iend-HASH_READ_SIZE);
                DEBUGLOG(4, "Using chain-based hash table for lazy dict");
            }
        }
        break;

    case ZSTD_btlazy2:   /* we want the dictionary table fully sorted */
    case ZSTD_btopt:
    case ZSTD_btultra:
    case ZSTD_btultra2:
        assert(srcSize >= HASH_READ_SIZE);
        ZSTD_updateTree(ms, iend-HASH_READ_SIZE, iend);
        break;

    default:
        assert(0);  /* not possible : not a valid strategy id */
    }

    ms->nextToUpdate = (U32)(iend - ms->window.base);
    return 0;
}